

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O2

Vec_Wrd_t * Mf_ManTruthCollect(int Limit)

{
  byte bVar1;
  int *__ptr;
  int *__ptr_00;
  Vec_Wrd_t *pVVar2;
  Vec_Wrd_t *pVVar3;
  word *__ptr_01;
  int *piVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  word Truth;
  ulong uVar15;
  bool bVar16;
  word local_70;
  Vec_Wrd_t *local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  long local_48;
  ulong local_40;
  int *local_38;
  long lVar14;
  
  __ptr = Extra_PermSchedule(6);
  __ptr_00 = Extra_GreyCodeSchedule(6);
  pVVar2 = Mpm_ManGetTruthWithCnf(Limit);
  pVVar3 = (Vec_Wrd_t *)malloc(0x10);
  pVVar3->nCap = 0x100000;
  pVVar3->nSize = 0;
  __ptr_01 = (word *)malloc(0x800000);
  pVVar3->pArray = __ptr_01;
  lVar14 = 0;
  uVar10 = 0x100000;
  iVar8 = 0;
  local_68 = pVVar2;
  do {
    pVVar2 = local_68;
    if (local_68->nSize <= iVar8) {
      free(__ptr);
      free(__ptr_00);
      uVar15 = 0;
      printf("Original = %d.  ",(ulong)(uint)pVVar2->nSize);
      Vec_WrdFree(pVVar2);
      iVar8 = (int)lVar14;
      printf("Total = %d.  ");
      pVVar2 = Vec_WrdUniqifyHash(pVVar3,iVar8);
      Vec_WrdFree(pVVar3);
      uVar10 = pVVar2->nSize;
      uVar9 = (ulong)uVar10;
      printf("Unique = %d.  ");
      uVar6 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar6 = uVar15;
      }
      for (; uVar6 != uVar15; uVar15 = uVar15 + 1) {
        local_70 = Vec_WrdEntry(pVVar2,(int)uVar15);
        uVar9 = 6;
        Mf_ManTruthCanonicize(&local_70,6);
        pVVar2->pArray[uVar15] = local_70;
      }
      pVVar3 = Vec_WrdUniqifyHash(pVVar2,(int)uVar9);
      Vec_WrdFree(pVVar2);
      printf("Unique = %d.  \n",(ulong)(uint)pVVar3->nSize);
      return pVVar3;
    }
    local_60 = Vec_WrdEntry(local_68,iVar8);
    lVar7 = 0;
    while (lVar7 != 2) {
      Truth = -lVar7 ^ local_60;
      lVar11 = 0;
      local_58 = Truth;
      local_50 = lVar7;
      while (lVar11 != 0x2d0) {
        iVar12 = (int)lVar14;
        lVar14 = (long)iVar12;
        uVar5 = iVar12 * 2;
        lVar7 = 0x40;
        piVar4 = __ptr_00;
        local_48 = lVar11;
        local_40 = Truth;
        while (bVar16 = lVar7 != 0, lVar7 = lVar7 + -1, bVar16) {
          local_38 = piVar4;
          Truth = Abc_Tt6Flip(Truth,*piVar4);
          if ((uint)lVar14 == uVar10) {
            uVar13 = uVar5;
            if (lVar14 < 0x10) {
              uVar13 = 0x10;
            }
            if ((int)uVar10 < (int)uVar13) {
              if (__ptr_01 == (word *)0x0) {
                __ptr_01 = (word *)malloc((ulong)uVar13 << 3);
              }
              else {
                __ptr_01 = (word *)realloc(__ptr_01,(ulong)uVar13 << 3);
              }
              pVVar3->pArray = __ptr_01;
              uVar10 = uVar13;
              if (__ptr_01 == (word *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                              ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
              }
            }
          }
          __ptr_01[lVar14] = Truth;
          lVar14 = lVar14 + 1;
          piVar4 = local_38 + 1;
          uVar5 = uVar5 + 2;
        }
        if (local_40 != Truth) {
          __assert_fail("tTemp2 == tCur",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMf.c"
                        ,0xad,"Vec_Wrd_t *Mf_ManTruthCollect(int)");
        }
        iVar12 = __ptr[local_48];
        bVar1 = (byte)(1L << ((byte)iVar12 & 0x3f));
        Truth = (local_40 & s_PMasks[iVar12][2]) >> (bVar1 & 0x3f) |
                (s_PMasks[iVar12][1] & local_40) << (bVar1 & 0x3f) | s_PMasks[iVar12][0] & local_40;
        lVar11 = local_48 + 1;
      }
      lVar7 = local_50 + 1;
      if (local_58 != Truth) {
        __assert_fail("tTemp1 == tCur",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMf.c"
                      ,0xb0,"Vec_Wrd_t *Mf_ManTruthCollect(int)");
      }
    }
    pVVar3->nSize = (int)lVar14;
    pVVar3->nCap = uVar10;
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

Vec_Wrd_t * Mf_ManTruthCollect( int Limit )
{
    extern Vec_Wrd_t * Mpm_ManGetTruthWithCnf( int Limit );
    int * pPerm = Extra_PermSchedule( 6 );
    int * pComp = Extra_GreyCodeSchedule( 6 );
    Vec_Wrd_t * vTruths = Mpm_ManGetTruthWithCnf( Limit );
    Vec_Wrd_t * vResult = Vec_WrdAlloc( 1 << 20 );
    word uTruth, tCur, tTemp1, tTemp2;
    int i, p, c, k;
    Vec_WrdForEachEntry( vTruths, uTruth, k )
    {
        for ( i = 0; i < 2; i++ )
        {
            tCur = i ? ~uTruth : uTruth;
            tTemp1 = tCur;
            for ( p = 0; p < 720; p++ )
            {
                tTemp2 = tCur;
                for ( c = 0; c < 64; c++ )
                {
                    tCur = Abc_Tt6Flip( tCur, pComp[c] );
                    Vec_WrdPush( vResult, tCur );
                }
                assert( tTemp2 == tCur );
                tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[p] );
            }
            assert( tTemp1 == tCur );
        }
    }
    ABC_FREE( pPerm );
    ABC_FREE( pComp );
    printf( "Original = %d.  ", Vec_WrdSize(vTruths) );
    Vec_WrdFree( vTruths );
    printf( "Total = %d.  ", Vec_WrdSize(vResult) );
    vTruths = Vec_WrdUniqifyHash( vResult, 1 );
    Vec_WrdFree( vResult );
    printf( "Unique = %d.  ", Vec_WrdSize(vTruths) );
    Vec_WrdForEachEntry( vTruths, uTruth, k )
    {
        Mf_ManTruthCanonicize( &uTruth, 6 );
        Vec_WrdWriteEntry( vTruths, k, uTruth );
    }
    vResult = Vec_WrdUniqifyHash( vTruths, 1 );
    Vec_WrdFree( vTruths );
    printf( "Unique = %d.  \n", Vec_WrdSize(vResult) );
    return vResult;
}